

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O0

MPP_RET enc_impl_add_prefix(EncImpl impl,MppPacket pkt,RK_S32 *length,RK_U8 *uuid,void *data,
                           RK_S32 size)

{
  EncImplCtx *p;
  MPP_RET ret;
  RK_S32 size_local;
  void *data_local;
  RK_U8 *uuid_local;
  RK_S32 *length_local;
  MppPacket pkt_local;
  EncImpl impl_local;
  
  if ((pkt == (MppPacket)0x0) || (data == (void *)0x0)) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_add_prefix");
    impl_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    p._0_4_ = MPP_OK;
    if (*(long *)(*(long *)((long)impl + 0x18) + 0x50) == 0) {
      impl_local._4_4_ = MPP_OK;
    }
    else {
      if (*(long *)(*(long *)((long)impl + 0x18) + 0x50) != 0) {
        p._0_4_ = (**(code **)(*(long *)((long)impl + 0x18) + 0x50))(pkt,length,uuid,data,size);
      }
      impl_local._4_4_ = (MPP_RET)p;
    }
  }
  return impl_local._4_4_;
}

Assistant:

MPP_RET enc_impl_add_prefix(EncImpl impl, MppPacket pkt, RK_S32 *length,
                            RK_U8 uuid[16], const void *data, RK_S32 size)
{
    if (NULL == pkt || NULL == data) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;

    if (NULL == p->api->add_prefix)
        return ret;

    if (p->api->add_prefix)
        ret = p->api->add_prefix(pkt, length, uuid, data, size);

    return ret;
}